

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O1

void __thiscall TPZMultiphysicsCompMesh::CleanElementsConnects(TPZMultiphysicsCompMesh *this)

{
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_00;
  long lVar1;
  TPZCompEl **ppTVar2;
  TPZConnect *this_01;
  TPZAdmChunkVector<TPZConnect,_10> *this_02;
  long lVar3;
  
  lVar1 = (this->super_TPZCompMesh).fElementVec.super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar1) {
    this_00 = &(this->super_TPZCompMesh).fElementVec;
    lVar3 = 0;
    do {
      ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>,lVar3);
      if (*ppTVar2 != (TPZCompEl *)0x0) {
        (**(code **)(*(long *)*ppTVar2 + 8))();
        ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&this_00->super_TPZChunkVector<TPZCompEl_*,_10>,lVar3);
        *ppTVar2 = (TPZCompEl *)0x0;
      }
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  TPZAdmChunkVector<TPZCompEl_*,_10>::Resize(&(this->super_TPZCompMesh).fElementVec,0);
  lVar1 = (this->super_TPZCompMesh).fConnectVec.super_TPZChunkVector<TPZConnect,_10>.fNElements;
  this_02 = &(this->super_TPZCompMesh).fConnectVec;
  if (0 < lVar1) {
    lVar3 = 0;
    do {
      this_01 = TPZChunkVector<TPZConnect,_10>::operator[]
                          (&this_02->super_TPZChunkVector<TPZConnect,_10>,lVar3);
      TPZConnect::RemoveDepend(this_01);
      lVar3 = lVar3 + 1;
    } while (lVar1 != lVar3);
  }
  TPZAdmChunkVector<TPZConnect,_10>::Resize(this_02,0);
  return;
}

Assistant:

void TPZMultiphysicsCompMesh::CleanElementsConnects()
{
    int64_t nel = NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = Element(el);
        if(cel)
        {
            delete cel;
            fElementVec[el] = 0;
        }
    }
    fElementVec.Resize(0);
    nel = fConnectVec.NElements();
    for (int64_t el=0; el<nel; el++) {
        fConnectVec[el].RemoveDepend();
    }
    fConnectVec.Resize(0);
}